

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.cpp
# Opt level: O3

void __thiscall CLayers::CLayers(CLayers *this)

{
  this->m_pGameGroup = (CMapItemGroup *)0x0;
  this->m_pGameLayer = (CMapItemLayerTilemap *)0x0;
  this->m_GroupsNum = 0;
  this->m_GroupsStart = 0;
  this->m_LayersNum = 0;
  this->m_LayersStart = 0;
  this->m_pMap = (IMap *)0x0;
  return;
}

Assistant:

CLayers::CLayers()
{
	m_GroupsNum = 0;
	m_GroupsStart = 0;
	m_LayersNum = 0;
	m_LayersStart = 0;
	m_pGameGroup = 0;
	m_pGameLayer = 0;
	m_pMap = 0;
}